

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tok.c
# Opt level: O3

void tok_ifdef_ifndef(tokcxdef *ctx,char *p,int len,int is_ifdef)

{
  int iVar1;
  char *sym;
  tokdfdef *ptVar2;
  ulong uVar3;
  char mysym [39];
  char acStack_48 [40];
  
  iVar1 = tok_scan_defsym(ctx,p,len);
  if (iVar1 != 0) {
    sym = tok_casefold_defsym((tokcxdef *)(ulong)(uint)ctx->tokcxflg,acStack_48,p,iVar1);
    ptVar2 = tok_find_define(ctx,sym,iVar1);
    ctx->tokcxif[ctx->tokcxifcnt] = '\x02' - ((is_ifdef == 0) != (ptVar2 != (tokdfdef *)0x0));
    iVar1 = ctx->tokcxifcnt;
    if (iVar1 < 0x40) {
      ctx->tokcxifcnt = iVar1 + 1U;
      if (-1 < iVar1) {
        uVar3 = 0;
        do {
          ctx->tokcxifcur = (int)ctx->tokcxif[uVar3];
          if (ctx->tokcxif[uVar3] == '\x02') {
            return;
          }
          if (ctx->tokcxif[uVar3] == '\x04') {
            return;
          }
          uVar3 = uVar3 + 1;
        } while (iVar1 + 1U != uVar3);
      }
    }
    else {
      errlogf(ctx->tokcxerr,"TADS",0x74);
    }
  }
  return;
}

Assistant:

static void tok_ifdef_ifndef(tokcxdef *ctx, char *p, int len, int is_ifdef)
{
    int   symlen;
    char *sym;
    int   stat;
    int   found;
    char  mysym[TOKNAMMAX];

    /* get the symbol */
    sym = p;
    if (!(symlen = tok_scan_defsym(ctx, p, len)))
        return;

    /* if we're folding case, convert the symbol to lower case */
    sym = tok_casefold_defsym(ctx, mysym, sym, symlen);

    /* see if we can find it in the table, and set the status accordingly */
    found = (tok_find_define(ctx, sym, symlen) != 0);

    /* invert the test if this is an ifndef */
    if (!is_ifdef) found = !found;

    /* set the #if status accordingly */
    if (found)
        stat = TOKIF_IF_YES;
    else
        stat = TOKIF_IF_NO;
    ctx->tokcxif[ctx->tokcxifcnt] = stat;

    /* allocate a new #if level (making sure we have room) */
    if (ctx->tokcxifcnt >= TOKIFNEST)
    {
        errlog(ctx->tokcxerr, ERR_MANYPIF);
        return;
    }
    ctx->tokcxifcnt++;

    /* update the current status */
    tok_update_if_stat(ctx);
}